

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

void luaL_where(lua_State *L,int level)

{
  int iVar1;
  undefined1 local_98 [8];
  lua_Debug ar;
  int level_local;
  lua_State *L_local;
  
  ar.i_ci._4_4_ = level;
  iVar1 = lua_getstack(L,level,(lua_Debug *)local_98);
  if ((iVar1 == 0) || (lua_getinfo(L,"Sl",(lua_Debug *)local_98), (int)(uint)ar.source < 1)) {
    lua_pushfstring(L,"");
  }
  else {
    lua_pushfstring(L,"%s:%d: ",&ar.lastlinedefined,(ulong)(uint)ar.source);
  }
  return;
}

Assistant:

LUALIB_API void luaL_where (lua_State *L, int level) {
  lua_Debug ar;
  if (lua_getstack(L, level, &ar)) {  /* check function at level */
    lua_getinfo(L, "Sl", &ar);  /* get info about it */
    if (ar.currentline > 0) {  /* is there info? */
      lua_pushfstring(L, "%s:%d: ", ar.short_src, ar.currentline);
      return;
    }
  }
  lua_pushfstring(L, "");  /* else, no information available... */
}